

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::util_TrimString::test_method(util_TrimString *this)

{
  string_view pattern;
  string_view pattern_00;
  string_view pattern_01;
  string_view pattern_02;
  string_view pattern_03;
  string_view pattern_04;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view pattern_05;
  string_view pattern_06;
  string_view pattern_07;
  string_view pattern_08;
  string_view pattern_09;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  bool bVar1;
  long in_FS_OFFSET;
  string_view sVar2;
  string_view sVar3;
  char *in_stack_fffffffffffff488;
  char *in_stack_fffffffffffff490;
  char *in_stack_fffffffffffff498;
  allocator<char> *in_stack_fffffffffffff4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4a8;
  const_string *in_stack_fffffffffffff4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4b8;
  const_string *in_stack_fffffffffffff4c0;
  unit_test_log_t *in_stack_fffffffffffff4c8;
  size_t in_stack_fffffffffffff4d0;
  size_t sVar4;
  char *in_stack_fffffffffffff4d8;
  char *pcVar5;
  size_t in_stack_fffffffffffff4f0;
  allocator<char> *in_stack_fffffffffffff4f8;
  size_t in_stack_fffffffffffff500;
  allocator<char> *paVar6;
  char *in_stack_fffffffffffff508;
  allocator<char> *paVar7;
  undefined1 local_7d2;
  undefined1 local_7d1;
  string_view local_7d0;
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [48];
  char local_780 [21];
  allocator<char> local_76b;
  allocator<char> local_76a;
  allocator<char> local_769;
  undefined1 local_768 [16];
  undefined1 local_758 [71];
  allocator<char> local_711 [24];
  allocator<char> local_6f9;
  string_view local_6f8;
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [71];
  allocator<char> local_691 [24];
  allocator<char> local_679;
  undefined1 local_678 [16];
  undefined1 local_668 [71];
  allocator<char> local_621 [24];
  allocator<char> local_609;
  string_view local_608;
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [71];
  allocator<char> local_5a1 [24];
  allocator<char> local_589;
  undefined1 local_588 [16];
  undefined1 local_578 [96];
  string_view local_518;
  undefined1 local_508 [16];
  undefined1 local_4f8 [96];
  undefined1 local_498 [16];
  undefined1 local_488 [96];
  string_view local_428;
  undefined1 local_418 [16];
  undefined1 local_408 [96];
  undefined1 local_3a8 [16];
  undefined1 local_398 [96];
  string_view local_338;
  undefined1 local_328 [16];
  undefined1 local_318 [96];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [128];
  lazy_ostream local_228 [6];
  undefined1 local_1c8 [32];
  lazy_ostream local_1a8 [4];
  lazy_ostream local_168 [4];
  undefined1 local_128 [32];
  lazy_ostream local_108 [4];
  lazy_ostream local_c8 [4];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8
               ,in_stack_fffffffffffff4b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff490,(char (*) [1])in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    str_05._M_str = in_stack_fffffffffffff508;
    str_05._M_len = in_stack_fffffffffffff500;
    sVar2._M_str = (char *)in_stack_fffffffffffff4f8;
    sVar2._M_len = in_stack_fffffffffffff4f0;
    util::TrimString_abi_cxx11_(str_05,sVar2);
    in_stack_fffffffffffff498 = "\"foo bar\"";
    in_stack_fffffffffffff490 = "foo bar";
    in_stack_fffffffffffff488 = "TrimString(\" foo bar \")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
              (local_2a8,local_2b8,0x138,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8
               ,in_stack_fffffffffffff4b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff490,(char (*) [1])in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    str._M_str = in_stack_fffffffffffff4d8;
    str._M_len = in_stack_fffffffffffff4d0;
    pattern._M_str = (char *)in_stack_fffffffffffff4c8;
    pattern._M_len = (size_t)in_stack_fffffffffffff4c0;
    sVar2 = util::TrimStringView(str,pattern);
    in_stack_fffffffffffff498 = "\"foo \\n \\f\\n\\r\\t\\v\\tbar\"";
    in_stack_fffffffffffff490 = "foo \n \f\n\r\t\v\tbar";
    in_stack_fffffffffffff488 =
         "TrimStringView(\"\\t \\n  \\n \\f\\n\\r\\t\\v\\tfoo \\n \\f\\n\\r\\t\\v\\tbar\\t  \\n \\f\\n\\r\\t\\v\\t\\n \")"
    ;
    local_338 = sVar2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,char[16]>
              (local_318,local_328,0x139,1,2,&local_338);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8
               ,in_stack_fffffffffffff4b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff490,(char (*) [1])in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    str_06._M_str = in_stack_fffffffffffff508;
    str_06._M_len = in_stack_fffffffffffff500;
    pattern_05._M_str = (char *)in_stack_fffffffffffff4f8;
    pattern_05._M_len = in_stack_fffffffffffff4f0;
    util::TrimString_abi_cxx11_(str_06,pattern_05);
    in_stack_fffffffffffff498 = "\"foo \\n\\tbar\"";
    in_stack_fffffffffffff490 = "foo \n\tbar";
    in_stack_fffffffffffff488 = "TrimString(\"\\t \\n foo \\n\\tbar\\t \\n \")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
              (local_398,local_3a8,0x13a,1,2,local_48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8
               ,in_stack_fffffffffffff4b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff490,(char (*) [1])in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    str_00._M_str = in_stack_fffffffffffff4d8;
    str_00._M_len = in_stack_fffffffffffff4d0;
    pattern_00._M_str = (char *)in_stack_fffffffffffff4c8;
    pattern_00._M_len = (size_t)in_stack_fffffffffffff4c0;
    sVar2 = util::TrimStringView(str_00,pattern_00);
    in_stack_fffffffffffff498 = "\"\\t \\n foo \\n\\tbar\\t \\n \"";
    in_stack_fffffffffffff490 = "\t \n foo \n\tbar\t \n ";
    in_stack_fffffffffffff488 = "TrimStringView(\"\\t \\n foo \\n\\tbar\\t \\n \", \"fobar\")";
    local_428 = sVar2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,char[18]>
              (local_408,local_418,0x13b,1,2,&local_428);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8
               ,in_stack_fffffffffffff4b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff490,(char (*) [1])in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    str_07._M_str = in_stack_fffffffffffff508;
    str_07._M_len = in_stack_fffffffffffff500;
    pattern_06._M_str = (char *)in_stack_fffffffffffff4f8;
    pattern_06._M_len = in_stack_fffffffffffff4f0;
    util::TrimString_abi_cxx11_(str_07,pattern_06);
    in_stack_fffffffffffff498 = "\"foo bar\"";
    in_stack_fffffffffffff490 = "foo bar";
    in_stack_fffffffffffff488 = "TrimString(\"foo bar\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
              (local_488,local_498,0x13c,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8
               ,in_stack_fffffffffffff4b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff490,(char (*) [1])in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    str_01._M_str = in_stack_fffffffffffff4d8;
    str_01._M_len = in_stack_fffffffffffff4d0;
    pattern_01._M_str = (char *)in_stack_fffffffffffff4c8;
    pattern_01._M_len = (size_t)in_stack_fffffffffffff4c0;
    sVar2 = util::TrimStringView(str_01,pattern_01);
    in_stack_fffffffffffff498 = "\" \"";
    in_stack_fffffffffffff490 = " ";
    in_stack_fffffffffffff488 = "TrimStringView(\"foo bar\", \"fobar\")";
    local_518 = sVar2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,char[2]>
              (local_4f8,local_508,0x13d,1,2,&local_518);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8
               ,in_stack_fffffffffffff4b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff490,(char (*) [1])in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffff4b8,(char *)in_stack_fffffffffffff4b0,
               (size_type)in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    str_08._M_str = in_stack_fffffffffffff508;
    str_08._M_len = in_stack_fffffffffffff500;
    pattern_07._M_str = (char *)in_stack_fffffffffffff4f8;
    pattern_07._M_len = in_stack_fffffffffffff4f0;
    util::TrimString_abi_cxx11_(str_08,pattern_07);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffff4b8,(char *)in_stack_fffffffffffff4b0,
               (size_type)in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    in_stack_fffffffffffff498 = "std::string(\"\\0 foo \\0\", 7)";
    in_stack_fffffffffffff490 = (char *)local_c8;
    in_stack_fffffffffffff488 = "TrimString(std::string(\"\\0 foo \\0 \", 8))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_578,local_588,0x13e,1,2,local_88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::allocator<char>::~allocator(local_5a1);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::allocator<char>::~allocator(&local_589);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8
               ,in_stack_fffffffffffff4b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff490,(char (*) [1])in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffff4b8,(char *)in_stack_fffffffffffff4b0,
               (size_type)in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    str_02._M_str = in_stack_fffffffffffff4d8;
    str_02._M_len = in_stack_fffffffffffff4d0;
    pattern_02._M_str = (char *)in_stack_fffffffffffff4c8;
    pattern_02._M_len = (size_t)in_stack_fffffffffffff4c0;
    sVar2 = util::TrimStringView(str_02,pattern_02);
    local_608 = sVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffff4b8,(char *)in_stack_fffffffffffff4b0,
               (size_type)in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    in_stack_fffffffffffff498 = "std::string(\"foo\", 3)";
    in_stack_fffffffffffff490 = (char *)local_108;
    in_stack_fffffffffffff488 = "TrimStringView(std::string(\" foo \", 5))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              (local_5e8,local_5f8,0x13f,1,2,&local_608);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::allocator<char>::~allocator(local_621);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::allocator<char>::~allocator(&local_609);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8
               ,in_stack_fffffffffffff4b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff490,(char (*) [1])in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffff4b8,(char *)in_stack_fffffffffffff4b0,
               (size_type)in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    str_09._M_str = in_stack_fffffffffffff508;
    str_09._M_len = in_stack_fffffffffffff500;
    pattern_08._M_str = (char *)in_stack_fffffffffffff4f8;
    pattern_08._M_len = in_stack_fffffffffffff4f0;
    util::TrimString_abi_cxx11_(str_09,pattern_08);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffff4b8,(char *)in_stack_fffffffffffff4b0,
               (size_type)in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    in_stack_fffffffffffff498 = "std::string(\"\\0\\0\", 2)";
    in_stack_fffffffffffff490 = (char *)local_168;
    in_stack_fffffffffffff488 = "TrimString(std::string(\"\\t\\t\\0\\0\\n\\n\", 6))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_668,local_678,0x140,1,2,local_128);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::allocator<char>::~allocator(local_691);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::allocator<char>::~allocator(&local_679);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8
               ,in_stack_fffffffffffff4b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff490,(char (*) [1])in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffff4b8,(char *)in_stack_fffffffffffff4b0,
               (size_type)in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4a8,
               (char *)in_stack_fffffffffffff4a0);
    str_03._M_str = in_stack_fffffffffffff4d8;
    str_03._M_len = in_stack_fffffffffffff4d0;
    pattern_03._M_str = (char *)in_stack_fffffffffffff4c8;
    pattern_03._M_len = (size_t)in_stack_fffffffffffff4c0;
    sVar2 = util::TrimStringView(str_03,pattern_03);
    local_6f8 = sVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffff4b8,(char *)in_stack_fffffffffffff4b0,
               (size_type)in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    in_stack_fffffffffffff498 = "std::string(\"\\x05\\x04\\x03\\x02\\x01\\x00\", 6)";
    in_stack_fffffffffffff490 = (char *)local_1a8;
    in_stack_fffffffffffff488 = "TrimStringView(std::string(\"\\x05\\x04\\x03\\x02\\x01\\x00\", 6))"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              (local_6d8,local_6e8,0x141,1,2,&local_6f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::allocator<char>::~allocator(local_711);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::allocator<char>::~allocator(&local_6f9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8
               ,in_stack_fffffffffffff4b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff490,(char (*) [1])in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    paVar7 = &local_769;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffff4b8,(char *)in_stack_fffffffffffff4b0,
               (size_type)in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
    paVar6 = &local_76a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffff4b8,(char *)in_stack_fffffffffffff4b0,
               (size_type)in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
    str_10._M_str = (char *)paVar7;
    str_10._M_len = (size_t)paVar6;
    pattern_09._M_str = (char *)in_stack_fffffffffffff4f8;
    pattern_09._M_len = in_stack_fffffffffffff4f0;
    util::TrimString_abi_cxx11_(str_10,pattern_09);
    in_stack_fffffffffffff4f8 = &local_76b;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffff4b8,(char *)in_stack_fffffffffffff4b0,
               (size_type)in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    in_stack_fffffffffffff498 = "std::string(\"\\0\", 1)";
    in_stack_fffffffffffff490 = (char *)local_228;
    in_stack_fffffffffffff488 =
         "TrimString(std::string(\"\\x05\\x04\\x03\\x02\\x01\\x00\", 6), std::string(\"\\x05\\x04\\x03\\x02\\x01\", 5))"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_758,local_768,0x142,1,2,local_1c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::allocator<char>::~allocator(&local_76b);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::allocator<char>::~allocator(&local_76a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::allocator<char>::~allocator(&local_769);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    sVar3._M_str = (char *)in_stack_fffffffffffff4b0;
    sVar3._M_len = (size_t)in_stack_fffffffffffff4b8;
  } while (bVar1);
  do {
    pcVar5 = local_780;
    sVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,sVar3._M_len,
               (const_string *)sVar3._M_str);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff490,(char (*) [1])in_stack_fffffffffffff488);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (unsigned_long)in_stack_fffffffffffff488);
    in_stack_fffffffffffff4c8 = (unit_test_log_t *)&local_7d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar3._M_len,
               sVar3._M_str,(size_type)in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
    in_stack_fffffffffffff4c0 = (const_string *)&local_7d2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar3._M_len,
               sVar3._M_str,(size_type)in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff4a8);
    str_04._M_str = pcVar5;
    str_04._M_len = sVar4;
    pattern_04._M_str = (char *)in_stack_fffffffffffff4c8;
    pattern_04._M_len = (size_t)in_stack_fffffffffffff4c0;
    sVar3 = util::TrimStringView(str_04,pattern_04);
    in_stack_fffffffffffff498 = "\"\"";
    in_stack_fffffffffffff490 = "";
    in_stack_fffffffffffff488 =
         "TrimStringView(std::string(\"\\x05\\x04\\x03\\x02\\x01\\x00\", 6), std::string(\"\\x05\\x04\\x03\\x02\\x01\\x00\", 6))"
    ;
    local_7d0 = sVar3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::basic_string_view<char,std::char_traits<char>>,char[1]>
              (local_7b0,local_7c0,0x143,1,2,&local_7d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::allocator<char>::~allocator((allocator<char> *)&local_7d2);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff488);
    std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff488);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_TrimString)
{
    BOOST_CHECK_EQUAL(TrimString(" foo bar "), "foo bar");
    BOOST_CHECK_EQUAL(TrimStringView("\t \n  \n \f\n\r\t\v\tfoo \n \f\n\r\t\v\tbar\t  \n \f\n\r\t\v\t\n "), "foo \n \f\n\r\t\v\tbar");
    BOOST_CHECK_EQUAL(TrimString("\t \n foo \n\tbar\t \n "), "foo \n\tbar");
    BOOST_CHECK_EQUAL(TrimStringView("\t \n foo \n\tbar\t \n ", "fobar"), "\t \n foo \n\tbar\t \n ");
    BOOST_CHECK_EQUAL(TrimString("foo bar"), "foo bar");
    BOOST_CHECK_EQUAL(TrimStringView("foo bar", "fobar"), " ");
    BOOST_CHECK_EQUAL(TrimString(std::string("\0 foo \0 ", 8)), std::string("\0 foo \0", 7));
    BOOST_CHECK_EQUAL(TrimStringView(std::string(" foo ", 5)), std::string("foo", 3));
    BOOST_CHECK_EQUAL(TrimString(std::string("\t\t\0\0\n\n", 6)), std::string("\0\0", 2));
    BOOST_CHECK_EQUAL(TrimStringView(std::string("\x05\x04\x03\x02\x01\x00", 6)), std::string("\x05\x04\x03\x02\x01\x00", 6));
    BOOST_CHECK_EQUAL(TrimString(std::string("\x05\x04\x03\x02\x01\x00", 6), std::string("\x05\x04\x03\x02\x01", 5)), std::string("\0", 1));
    BOOST_CHECK_EQUAL(TrimStringView(std::string("\x05\x04\x03\x02\x01\x00", 6), std::string("\x05\x04\x03\x02\x01\x00", 6)), "");
}